

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O2

void adios2::helper::CalculateSubblockInfo(Dims *count,BlockDivisionInfo *info)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  ulong in_RAX;
  unsigned_short uVar4;
  ulong uVar5;
  ulong uVar6;
  uint16_t uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uStack_28;
  
  uVar9 = (ulong)((long)(count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar8 = (int)uVar9;
  uStack_28 = in_RAX & 0xffffffffffff;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&info->Rem,(long)iVar8,(value_type_conflict7 *)((long)&uStack_28 + 6));
  uStack_28._0_6_ = (uint6)(uint)uStack_28;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&info->ReverseDivProduct,(long)iVar8,(value_type_conflict7 *)((long)&uStack_28 + 4));
  puVar1 = (count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (info->Div).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (info->Rem).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < iVar8) {
    uVar6 = uVar9 & 0xffffffff;
  }
  uVar7 = 1;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    puVar3[uVar5] = (unsigned_short)(puVar1[uVar5] % (ulong)puVar2[uVar5]);
    uVar7 = uVar7 * puVar2[uVar5];
  }
  info->NBlocks = uVar7;
  puVar2 = (info->Div).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (info->ReverseDivProduct).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 1;
  for (uVar9 = uVar9 & 0xffffffff; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
    puVar3[uVar9 - 1] = uVar4;
    uVar4 = uVar4 * puVar2[uVar9 - 1];
  }
  return;
}

Assistant:

void CalculateSubblockInfo(const Dims &count, BlockDivisionInfo &info) noexcept
{
    const int ndim = static_cast<int>(count.size());
    info.Rem.resize(ndim, 0);
    info.ReverseDivProduct.resize(ndim, 0);
    uint16_t n = 1;
    // remainders + nBlocks calculation
    for (int j = 0; j < ndim; ++j)
    {
        info.Rem[j] = count[j] % info.Div[j];
        n = n * info.Div[j];
    }
    info.NBlocks = n;

    // division vector for calculating N-dim blockIDs from blockID
    uint16_t d = 1; // div[n-2] * div[n-3] * ... div[0]
    for (int j = ndim - 1; j >= 0; --j)
    {
        info.ReverseDivProduct[j] = d;
        d = d * info.Div[j];
    }
}